

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O0

void __thiscall
wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::TypeRewriter::
modifyStruct(wasm::HeapType,wasm::Struct__(void *this,HeapType oldStructType,Struct *struct_)

{
  bool bVar1;
  Struct *this_00;
  size_type sVar2;
  const_reference pvVar3;
  StructValues<wasm::LUBFinder> *this_01;
  LUBFinder *this_02;
  Type TVar4;
  reference pvVar5;
  Type newType;
  Type oldType;
  Index i;
  FieldList *newFields;
  FieldList *oldFields;
  Struct *struct__local;
  TypeRewriter *this_local;
  HeapType oldStructType_local;
  
  this_local = (TypeRewriter *)oldStructType.id;
  this_00 = HeapType::getStruct((HeapType *)&this_local);
  for (oldType.id._4_4_ = 0;
      sVar2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&struct_->fields),
      oldType.id._4_4_ < sVar2; oldType.id._4_4_ = oldType.id._4_4_ + 1) {
    pvVar3 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                       (&this_00->fields,(ulong)oldType.id._4_4_);
    newType.id = (pvVar3->type).id;
    bVar1 = wasm::Type::isRef(&newType);
    if (bVar1) {
      this_01 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                          ((StructValuesMap<wasm::LUBFinder> *)(*(long *)((long)this + 0x68) + 0x30)
                           ,(HeapType)this_local);
      this_02 = StructUtils::StructValues<wasm::LUBFinder>::operator[]
                          (this_01,(ulong)oldType.id._4_4_);
      TVar4 = LUBFinder::getLUB(this_02);
      TVar4 = GlobalTypeRewriter::getTempType((GlobalTypeRewriter *)this,TVar4);
      pvVar5 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                         (&struct_->fields,(ulong)oldType.id._4_4_);
      (pvVar5->type).id = TVar4.id;
    }
  }
  return;
}

Assistant:

void modifyStruct(HeapType oldStructType, Struct& struct_) override {
        const auto& oldFields = oldStructType.getStruct().fields;
        auto& newFields = struct_.fields;

        for (Index i = 0; i < newFields.size(); i++) {
          auto oldType = oldFields[i].type;
          if (!oldType.isRef()) {
            continue;
          }
          auto newType = parent.finalInfos[oldStructType][i].getLUB();
          newFields[i].type = getTempType(newType);
        }
      }